

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void build_impute_node<InputData<float,long>&,WorkerMemory<ImputedData<long,long_double>,long_double,float>&,long_double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<long,_long_double>,_long_double,_float> *workspace,
               InputData<float,_long> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this;
  WeighImpRows WVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pIVar4;
  pointer pdVar5;
  double *pdVar6;
  float *pfVar7;
  bool bVar8;
  bool bVar9;
  uchar *puVar10;
  int *piVar11;
  ulong uVar12;
  long *plVar13;
  ulong *puVar14;
  double *cat;
  double *pdVar15;
  ulong *key;
  size_t sVar16;
  ImputeNode *pIVar17;
  pointer pvVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  pointer puVar22;
  size_t sVar23;
  size_t col_1;
  ulong uVar24;
  size_t col;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long *plVar28;
  long lVar29;
  size_t sVar30;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *prVar31;
  long lVar32;
  longdouble in_ST0;
  longdouble lVar33;
  longdouble lVar34;
  longdouble lVar35;
  int iVar41;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar50;
  double dVar48;
  undefined1 auVar49 [16];
  double dVar51;
  undefined1 auVar52 [16];
  double dVar53;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar54;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *__range3_1;
  size_t ix;
  double __tmp;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff08;
  tuple<> local_e1;
  ImputeNode *local_e0;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_d8;
  longdouble local_d0;
  longdouble local_c0;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_b0;
  double local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  unsigned_long local_90;
  undefined1 local_88 [16];
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_78;
  size_t local_70;
  ModelParams *local_68;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_60;
  double local_58;
  double local_50;
  double local_48;
  long local_40;
  double local_38;
  
  bVar8 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  bVar9 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_d0 = (longdouble)CONCAT91(local_d0._1_9_,!bVar8 || !bVar9);
  local_e0 = imputer;
  local_78 = imputer_tree;
  local_70 = curr_depth;
  local_68 = model_params;
  if (bVar8 && bVar9) {
    lVar26 = (workspace->end - workspace->st) + 1;
    auVar38._8_4_ = (int)((ulong)lVar26 >> 0x20);
    auVar38._0_8_ = lVar26;
    auVar38._12_4_ = 0x45300000;
    dVar37 = auVar38._8_8_ - 1.9342813113834067e+25;
    local_88._0_8_ = dVar37 + ((double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0);
    local_88._8_8_ = dVar37;
  }
  else {
    calculate_sum_weights<long_double>
              ((longdouble *)workspace,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)workspace->st,workspace->end
               ,curr_depth,(size_t)&workspace->weights_arr,
               (vector<double,_std::allocator<double>_> *)&workspace->weights_map,
               in_stack_ffffffffffffff08);
    local_38 = (double)in_ST0;
    local_88._8_8_ = 0;
    local_88._0_8_ = local_38;
  }
  pIVar17 = local_e0;
  local_d8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_e0->num_sum,input_data->ncols_numeric,(value_type_conflict *)&local_d8);
  local_a0 = &pIVar17->num_weight;
  local_d8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_a0,input_data->ncols_numeric,(value_type_conflict *)&local_d8);
  this = &pIVar17->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this,input_data->ncols_categ);
  local_98 = &pIVar17->cat_weight;
  local_d8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_98,input_data->ncols_categ,(value_type_conflict *)&local_d8);
  if ((pIVar17->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar17->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&pIVar17->num_sum);
  }
  if ((pIVar17->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar17->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_a0)
    ;
  }
  if ((pIVar17->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pIVar17->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
    ::_S_do_it(this);
  }
  if ((pIVar17->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar17->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_98)
    ;
  }
  if (input_data->ncols_categ == 0) {
    uVar12 = 0;
  }
  else {
    lVar26 = 0;
    uVar27 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar26),(long)input_data->ncat[uVar27]);
      pvVar18 = (this->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar26 + 0x10) !=
          *(long *)((long)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar26 + 8)) {
        std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar26));
      }
      uVar27 = uVar27 + 1;
      uVar12 = input_data->ncols_categ;
      lVar26 = lVar26 + 0x18;
    } while (uVar27 < uVar12);
  }
  uVar27 = input_data->ncols_numeric;
  dVar37 = (double)local_88._0_8_;
  if ((uVar12 != 0) || (input_data->Xc_indptr == (long *)0x0 && uVar27 != 0)) {
    pfVar7 = input_data->numeric_data;
    local_c0 = (longdouble)CONCAT28(local_c0._8_2_,pfVar7);
    if (local_d0._0_1_ == '\0') {
      if (uVar27 != 0 && pfVar7 != (float *)0x0) {
        puVar22 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar24 = workspace->st;
        uVar25 = workspace->end;
        local_a8 = (double)input_data->nrows;
        pdVar2 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar21 = 0;
        dVar36 = (double)DAT_0036e1d0;
        dVar51 = DAT_0036e1d0._8_8_;
        local_d0 = (longdouble)CONCAT28(local_d0._8_2_,uVar24);
        do {
          dVar48 = 0.0;
          if (uVar24 <= uVar25) {
            pdVar3 = (local_e0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            lVar26 = 0;
            uVar20 = uVar24;
            do {
              dVar48 = (double)pfVar7[(long)local_a8 * uVar21 + puVar22[uVar20]];
              if (ABS(dVar48) != INFINITY && !NAN(pfVar7[(long)local_a8 * uVar21 + puVar22[uVar20]])
                 ) {
                lVar26 = lVar26 + 1;
                local_48 = pdVar3[uVar21];
                local_50 = dVar48 - local_48;
                pdVar3[uVar21] =
                     (double)((float)local_50 / ((float)lVar26 + (float)(&DAT_0036e0d8)[lVar26 < 0])
                             + (float)local_48);
                local_40 = lVar26;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 <= uVar25);
            auVar45._8_4_ = (int)((ulong)lVar26 >> 0x20);
            auVar45._0_8_ = lVar26;
            auVar45._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar48 = (auVar45._8_8_ - dVar51) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar26) - dVar36);
          }
          pdVar2[uVar21] = dVar48;
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar27);
      }
      piVar11 = input_data->categ_data;
      if (uVar12 != 0 && piVar11 != (int *)0x0) {
        puVar22 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar27 = workspace->st;
        uVar24 = workspace->end;
        sVar16 = input_data->nrows;
        local_c0 = (longdouble)CONCAT28(local_c0._8_2_,sVar16);
        pdVar2 = (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar25 = 0;
        dVar36 = (double)DAT_0036e1d0;
        dVar51 = DAT_0036e1d0._8_8_;
        do {
          dVar48 = 0.0;
          if (uVar27 <= uVar24) {
            pvVar18 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar26 = 0;
            uVar21 = uVar27;
            do {
              lVar32 = (long)piVar11[sVar16 * uVar25 + puVar22[uVar21]];
              if (-1 < lVar32) {
                lVar26 = lVar26 + 1;
                lVar29 = *(long *)&pvVar18[uVar25].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar29 + lVar32 * 8) = *(double *)(lVar29 + lVar32 * 8) + 1.0;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 <= uVar24);
            auVar47._8_4_ = (int)((ulong)lVar26 >> 0x20);
            auVar47._0_8_ = lVar26;
            auVar47._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar48 = (auVar47._8_8_ - dVar51) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar26) - dVar36);
          }
          pdVar2[uVar25] = dVar48;
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar12);
      }
    }
    else {
      if (uVar27 != 0 && pfVar7 != (float *)0x0) {
        local_b0 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    *)&workspace->weights_map;
        uVar12 = workspace->end;
        uVar24 = 0;
        pIVar17 = local_e0;
        do {
          uVar25 = workspace->st;
          if (uVar12 < uVar25) {
            lVar34 = (longdouble)0;
          }
          else {
            lVar26 = uVar25 * 8;
            lVar34 = (longdouble)0;
            lVar35 = lVar34;
            do {
              puVar22 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar32 = *(long *)((long)puVar22 + lVar26);
              dVar36 = (double)input_data->numeric_data[lVar32 + input_data->nrows * uVar24];
              if (ABS(dVar36) != INFINITY &&
                  !NAN(input_data->numeric_data[lVar32 + input_data->nrows * uVar24])) {
                pdVar2 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar2) {
                  local_d8._M_head_impl = (unsigned_long *)((long)puVar22 + lVar26);
                  local_d0 = lVar35;
                  local_c0 = lVar34;
                  local_a8 = dVar36;
                  pVar54 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     (local_b0,local_d8._M_head_impl,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_d8,(tuple<> *)&local_90
                                     );
                  puVar10 = (pVar54.first.m_bucket.m_bucket)->m_value + 8;
                  uVar12 = workspace->end;
                  lVar33 = local_c0;
                  lVar35 = local_d0;
                  dVar37 = (double)local_88._0_8_;
                  dVar36 = local_a8;
                }
                else {
                  puVar10 = (uchar *)(pdVar2 + lVar32);
                  lVar33 = lVar34;
                }
                local_58 = *(double *)puVar10;
                pdVar2 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar2[uVar24] = pdVar2[uVar24] + local_58;
                local_58 = dVar36 * local_58;
                lVar34 = lVar33 + ((longdouble)local_58 - lVar35);
                lVar35 = (lVar34 - lVar33) - ((longdouble)local_58 - lVar35);
              }
              uVar25 = uVar25 + 1;
              lVar26 = lVar26 + 8;
            } while (uVar25 <= uVar12);
            uVar27 = input_data->ncols_numeric;
            pIVar17 = local_e0;
          }
          (pIVar17->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar24] =
               (double)(lVar34 / (longdouble)
                                 (pIVar17->num_weight).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar24]);
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar27);
        uVar12 = input_data->ncols_categ;
      }
      if ((uVar12 != 0) && (uVar27 = workspace->st, uVar27 <= workspace->end)) {
        do {
          local_90 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27];
          pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar2) {
            local_d8._M_head_impl = &local_90;
            pVar54 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&local_90,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_d8,&local_e1);
            puVar10 = (pVar54.first.m_bucket.m_bucket)->m_value + 8;
            uVar12 = input_data->ncols_categ;
            dVar37 = (double)local_88._0_8_;
          }
          else {
            puVar10 = (uchar *)(pdVar2 + local_90);
          }
          if (uVar12 != 0) {
            dVar36 = *(double *)puVar10;
            sVar16 = input_data->nrows;
            piVar11 = input_data->categ_data + local_90;
            pvVar18 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pdVar2 = (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar24 = 0;
            do {
              lVar26 = (long)*piVar11;
              if (-1 < lVar26) {
                lVar32 = *(long *)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar32 + lVar26 * 8) = *(double *)(lVar32 + lVar26 * 8) + dVar36;
                pdVar2[uVar24] = pdVar2[uVar24] + dVar36;
              }
              uVar24 = uVar24 + 1;
              piVar11 = piVar11 + sVar16;
              pvVar18 = pvVar18 + 1;
            } while (uVar12 != uVar24);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 <= workspace->end);
      }
    }
  }
  auVar45 = _DAT_0036e1f0;
  auVar38 = _DAT_0036e1e0;
  if (input_data->Xc_indptr != (long *)0x0) {
    puVar22 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_c0 = (longdouble)CONCAT28(local_c0._8_2_,puVar22);
    pdVar2 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar2 != pdVar3) {
      uVar12 = (long)pdVar3 + (-8 - (long)pdVar2);
      auVar39._8_4_ = (int)uVar12;
      auVar39._0_8_ = uVar12;
      auVar39._12_4_ = (int)(uVar12 >> 0x20);
      auVar40._0_8_ = uVar12 >> 3;
      auVar40._8_8_ = auVar39._8_8_ >> 3;
      uVar27 = 0;
      auVar40 = auVar40 ^ _DAT_0036e1f0;
      do {
        auVar46._8_4_ = (int)uVar27;
        auVar46._0_8_ = uVar27;
        auVar46._12_4_ = (int)(uVar27 >> 0x20);
        auVar47 = (auVar46 | auVar38) ^ auVar45;
        bVar8 = auVar40._0_4_ < auVar47._0_4_;
        iVar41 = auVar40._4_4_;
        iVar50 = auVar47._4_4_;
        if ((bool)(~(iVar41 < iVar50 || iVar50 == iVar41 && bVar8) & 1)) {
          pdVar2[uVar27] = dVar37;
        }
        if (iVar41 >= iVar50 && (iVar50 != iVar41 || !bVar8)) {
          pdVar2[uVar27 + 1] = dVar37;
        }
        uVar27 = uVar27 + 2;
      } while (((uVar12 >> 3) + 2 & 0xfffffffffffffffe) != uVar27);
    }
    sVar16 = input_data->ncols_numeric;
    if (sVar16 != 0) {
      puVar22 = puVar22 + 1;
      local_60 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  *)&workspace->weights_map;
      sVar19 = workspace->end;
      uVar12 = 0;
      local_d0 = (longdouble)CONCAT28(local_d0._8_2_,puVar22);
      do {
        plVar13 = input_data->Xc_ind;
        lVar26 = input_data->Xc_indptr[uVar12];
        key = (ulong *)(local_c0._0_8_ + workspace->st * 8);
        puVar14 = puVar22 + sVar19;
        uVar27 = (long)puVar14 - (long)key >> 3;
        if (0 < (long)uVar27) {
          do {
            uVar24 = uVar27 >> 1;
            uVar25 = ~uVar24 + uVar27;
            uVar27 = uVar24;
            if ((key + uVar24 + 1)[-1] < (ulong)plVar13[lVar26]) {
              key = key + uVar24 + 1;
              uVar27 = uVar25;
            }
          } while (0 < (long)uVar27);
        }
        puVar22 = local_d0._0_8_;
        if ((key != puVar14) &&
           (prVar31 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                       *)input_data->Xc_indptr[uVar12 + 1],
           (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
            *)lVar26 != prVar31)) {
          uVar27 = plVar13[(long)prVar31 + -1];
          uVar24 = *key;
          if (uVar24 <= uVar27) {
            lVar32 = (long)prVar31 + -1;
            local_b0 = prVar31;
            do {
              uVar25 = plVar13[lVar26];
              if (uVar25 == uVar24) {
                fVar44 = input_data->Xc[lVar26];
                pdVar2 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar2) {
                  dVar36 = 1.0;
                  if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
                    local_a8 = (double)CONCAT44(local_a8._4_4_,fVar44);
                    local_d8._M_head_impl = key;
                    pVar54 = tsl::detail_robin_hash::
                             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             ::
                             insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                       (local_60,key,
                                        (piecewise_construct_t *)&std::piecewise_construct,
                                        (tuple<const_unsigned_long_&> *)&local_d8,&local_e1);
                    puVar10 = (pVar54.first.m_bucket.m_bucket)->m_value + 8;
                    puVar22 = local_d0._0_8_;
                    prVar31 = local_b0;
                    dVar37 = (double)local_88._0_8_;
                    fVar44 = local_a8._0_4_;
                    goto LAB_002ca220;
                  }
                }
                else {
                  puVar10 = (uchar *)(pdVar2 + uVar24);
LAB_002ca220:
                  dVar36 = *(double *)puVar10;
                }
                if (ABS((double)fVar44) == INFINITY || NAN(fVar44)) {
                  pdVar2 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  pdVar2[uVar12] = pdVar2[uVar12] - dVar36;
                }
                else {
                  pdVar2 = (local_e0->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar2[uVar12] = dVar36 * (double)fVar44 + pdVar2[uVar12];
                }
                sVar19 = workspace->end;
                if ((key == (unsigned_long *)(local_c0._0_8_ + sVar19 * 8)) || (lVar26 == lVar32))
                break;
                plVar13 = input_data->Xc_ind;
                plVar28 = plVar13 + lVar26;
                key = key + 1;
                uVar24 = (long)plVar13 + (lVar32 * 8 - (long)plVar28) + 8 >> 3;
                if (0 < (long)uVar24) {
                  do {
                    uVar25 = uVar24 >> 1;
                    uVar21 = ~uVar25 + uVar24;
                    uVar24 = uVar25;
                    if ((ulong)(plVar28 + uVar25 + 1)[-1] < *key) {
                      plVar28 = plVar28 + uVar25 + 1;
                      uVar24 = uVar21;
                    }
                  } while (0 < (long)uVar24);
                }
LAB_002ca2ea:
                lVar26 = (long)plVar28 - (long)plVar13 >> 3;
              }
              else {
                if ((long)uVar25 <= (long)uVar24) {
                  plVar28 = plVar13 + lVar26 + 1;
                  uVar25 = (long)plVar13 + (lVar32 * 8 - (long)(plVar13 + lVar26 + 1)) + 8 >> 3;
                  while (0 < (long)uVar25) {
                    uVar21 = uVar25 >> 1;
                    uVar20 = ~uVar21 + uVar25;
                    uVar25 = uVar21;
                    if ((ulong)(plVar28 + uVar21 + 1)[-1] < uVar24) {
                      plVar28 = plVar28 + uVar21 + 1;
                      uVar25 = uVar20;
                    }
                  }
                  goto LAB_002ca2ea;
                }
                key = key + 1;
                uVar24 = (long)puVar14 - (long)key >> 3;
                while (0 < (long)uVar24) {
                  uVar21 = uVar24 >> 1;
                  uVar20 = ~uVar21 + uVar24;
                  uVar24 = uVar21;
                  if ((key + uVar21 + 1)[-1] < uVar25) {
                    key = key + uVar21 + 1;
                    uVar24 = uVar20;
                  }
                }
              }
              puVar14 = puVar22 + sVar19;
              if (((key == puVar14) ||
                  ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    *)lVar26 == prVar31)) || (uVar24 = *key, uVar27 < uVar24)) break;
            } while( true );
          }
          sVar16 = input_data->ncols_numeric;
        }
        pdVar2 = (local_e0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[uVar12] =
             pdVar2[uVar12] /
             (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar12 < sVar16);
    }
  }
  auVar42._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
  auVar42._8_4_ = (int)(min_imp_obs >> 0x20);
  auVar42._12_4_ = 0x45300000;
  dVar36 = (auVar42._8_8_ - 1.9342813113834067e+25) + (auVar42._0_8_ - 4503599627370496.0);
  pdVar2 = (local_e0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((local_e0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish != pdVar2) &&
     (sVar16 = input_data->ncols_numeric, sVar16 != 0)) {
    pdVar3 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar19 = local_e0->parent;
    pIVar4 = (local_78->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar23 = 0;
    do {
      pdVar15 = pdVar3 + sVar23;
      if (*pdVar15 <= dVar36 && dVar36 != *pdVar15) {
        dVar51 = *(double *)
                  (*(long *)&pIVar4[sVar19].num_sum.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  sVar23 * 8);
        dVar48 = 2.0;
        sVar30 = sVar19;
        if (0x7fefffffffffffff < (ulong)ABS(dVar51)) {
          lVar26 = 2;
          do {
            if (sVar30 == 0) {
              pdVar2[sVar23] = NAN;
              dVar48 = 0.0;
              goto LAB_002ca487;
            }
            sVar30 = pIVar4[sVar30].parent;
            dVar51 = *(double *)
                      (*(long *)&pIVar4[sVar30].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar23 * 8);
            lVar26 = lVar26 + 2;
          } while (0x7fefffffffffffff < (ulong)ABS(dVar51));
          auVar52._8_4_ = (int)((ulong)lVar26 >> 0x20);
          auVar52._0_8_ = lVar26;
          auVar52._12_4_ = 0x45300000;
          dVar48 = (auVar52._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0);
        }
        pdVar2[sVar23] =
             dVar51 / *(double *)
                       (*(long *)&pIVar4[sVar30].num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       sVar23 * 8);
        dVar48 = dVar37 / dVar48;
LAB_002ca487:
        pdVar3[sVar23] = dVar48;
      }
      sVar23 = sVar23 + 1;
    } while (sVar23 != sVar16);
  }
  pvVar18 = (local_e0->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((local_e0->cat_sum).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != pvVar18) &&
     (sVar16 = input_data->ncols_categ, sVar16 != 0)) {
    pdVar3 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar19 = local_e0->parent;
    pIVar4 = (local_78->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar11 = input_data->ncat;
    sVar23 = 0;
    do {
      if (dVar36 <= pdVar3[sVar23]) {
        pdVar6 = pvVar18[sVar23].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar15 = pvVar18[sVar23].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar15 != pdVar6; pdVar15 = pdVar15 + 1) {
          *pdVar15 = *pdVar15 / pdVar3[sVar23];
        }
      }
      else {
        lVar26 = *(long *)&pIVar4[sVar19].cat_weight.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        dVar51 = 2.0;
        sVar30 = sVar19;
        if (*(double *)(lVar26 + sVar23 * 8) <= 0.0) {
          lVar32 = 2;
          do {
            if (sVar30 == 0) goto LAB_002ca5d8;
            sVar30 = pIVar4[sVar30].parent;
            lVar26 = *(long *)&pIVar4[sVar30].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar32 = lVar32 + 2;
          } while (*(double *)(lVar26 + sVar23 * 8) <= 0.0);
          auVar49._8_4_ = (int)((ulong)lVar32 >> 0x20);
          auVar49._0_8_ = lVar32;
          auVar49._12_4_ = 0x45300000;
          dVar51 = (auVar49._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar32) - 4503599627370496.0);
        }
        iVar41 = piVar11[sVar23];
        if (0 < (long)iVar41) {
          lVar32 = *(long *)(*(long *)&pIVar4[sVar30].cat_sum.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl + sVar23 * 0x18);
          pdVar5 = pvVar18[sVar23].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar29 = 0;
          do {
            dVar48 = *(double *)(lVar32 + lVar29 * 8);
            dVar53 = 0.0;
            if (0.0 < dVar48) {
              dVar53 = dVar48 / *(double *)(lVar26 + sVar23 * 8);
            }
            pdVar5[lVar29] = dVar53 + pdVar5[lVar29];
            pdVar3[sVar23] = dVar37 / dVar51;
            lVar29 = lVar29 + 1;
          } while (iVar41 != lVar29);
        }
LAB_002ca5d8:
        dVar51 = 0.0;
        for (pdVar15 = pvVar18[sVar23].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar15 !=
            pvVar18[sVar23].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar15 = pdVar15 + 1) {
          dVar51 = dVar51 + *pdVar15;
        }
        pdVar3[sVar23] = dVar51;
      }
      sVar23 = sVar23 + 1;
    } while (sVar23 != sVar16);
  }
  WVar1 = local_68->weigh_imp_rows;
  if (WVar1 == Flat) {
    pdVar6 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 / dVar37;
    }
    pdVar6 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 / dVar37;
    }
  }
  else if (WVar1 == Inverse) {
    pdVar6 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 / (SQRT(dVar37) * dVar37);
    }
    pdVar6 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 / (SQRT(dVar37) * dVar37);
    }
  }
  lVar26 = local_70 + 1;
  auVar43._8_4_ = (int)((ulong)lVar26 >> 0x20);
  auVar43._0_8_ = lVar26;
  auVar43._12_4_ = 0x45300000;
  dVar37 = (auVar43._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0);
  if (local_68->depth_imp == Higher) {
    pdVar6 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 * dVar37;
    }
    pdVar6 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 * dVar37;
    }
  }
  else if (local_68->depth_imp == Lower) {
    pdVar6 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 / dVar37;
    }
    pdVar6 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar15 = (local_e0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar15 != pdVar6;
        pdVar15 = pdVar15 + 1) {
      *pdVar15 = *pdVar15 / dVar37;
    }
  }
  if ((WVar1 != Prop) || (local_68->depth_imp != Same)) {
    sVar16 = input_data->ncols_numeric;
    if (sVar16 != 0) {
      pdVar3 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar19 = 0;
      do {
        pdVar2[sVar19] = pdVar3[sVar19] * pdVar2[sVar19];
        sVar19 = sVar19 + 1;
      } while (sVar16 != sVar19);
    }
    sVar16 = input_data->ncols_categ;
    if (sVar16 != 0) {
      piVar11 = input_data->ncat;
      pdVar2 = (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar19 = 0;
      do {
        iVar41 = piVar11[sVar19];
        if (0 < (long)iVar41) {
          pdVar3 = pvVar18[sVar19].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar26 = 0;
          do {
            pdVar3[lVar26] = pdVar2[sVar19] * pdVar3[lVar26];
            lVar26 = lVar26 + 1;
          } while (iVar41 != lVar26);
        }
        sVar19 = sVar19 + 1;
      } while (sVar19 != sVar16);
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}